

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O2

QSslCertificate __thiscall
QTlsPrivate::X509CertificateOpenSSL::certificateFromX509(X509CertificateOpenSSL *this,X509 *x509)

{
  X509CertificateOpenSSL *this_00;
  Data *pDVar1;
  qsizetype qVar2;
  char *pcVar3;
  ASN1_TIME *pAVar4;
  X509 *pXVar5;
  X509_NAME *pXVar6;
  long lVar7;
  ASN1_INTEGER *pAVar8;
  int a;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char> local_70;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)&this->super_X509CertificateBase = 0xaaaaaaaaaaaaaaaa;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char *)0x0;
  local_58.size = 0;
  QSslCertificate::QSslCertificate((QSslCertificate *)this,(QByteArray *)&local_58,Pem);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  this_00 = *(X509CertificateOpenSSL **)(*(long *)&this->super_X509CertificateBase + 8);
  if (x509 != (X509 *)0x0 && this_00 != (X509CertificateOpenSSL *)0x0) {
    pAVar4 = q_X509_getm_notBefore(x509);
    if (pAVar4 != (ASN1_TIME *)0x0) {
      anon_unknown_2::dateTimeFromASN1((anon_unknown_2 *)&local_58,pAVar4);
      pDVar1 = *(Data **)&(this_00->super_X509CertificateBase).notValidBefore;
      *(Data **)&(this_00->super_X509CertificateBase).notValidBefore = local_58.d;
      local_58.d = pDVar1;
      QDateTime::~QDateTime((QDateTime *)&local_58);
    }
    pAVar4 = q_X509_getm_notAfter(x509);
    if (pAVar4 != (ASN1_TIME *)0x0) {
      anon_unknown_2::dateTimeFromASN1((anon_unknown_2 *)&local_58,pAVar4);
      pDVar1 = *(Data **)&(this_00->super_X509CertificateBase).notValidAfter;
      *(Data **)&(this_00->super_X509CertificateBase).notValidAfter = local_58.d;
      local_58.d = pDVar1;
      QDateTime::~QDateTime((QDateTime *)&local_58);
    }
    (this_00->super_X509CertificateBase).null = false;
    pXVar5 = q_X509_dup(x509);
    this_00->x509 = pXVar5;
    pXVar6 = q_X509_get_issuer_name(x509);
    anon_unknown_2::mapFromX509Name((anon_unknown_2 *)&local_58,pXVar6);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
    ::operator=(&(this_00->super_X509CertificateBase).issuerInfoEntries.d,
                (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
                 *)&local_58);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
                *)&local_58);
    pXVar6 = q_X509_get_subject_name(x509);
    anon_unknown_2::mapFromX509Name((anon_unknown_2 *)&local_58,pXVar6);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
    ::operator=(&(this_00->super_X509CertificateBase).subjectInfoEntries.d,
                (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
                 *)&local_58);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QString,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QString>_>_>_>_>
                *)&local_58);
    lVar7 = q_X509_get_version(x509);
    QByteArray::number((longlong)&local_58,(int)lVar7 + 1);
    pDVar1 = (this_00->super_X509CertificateBase).versionString.d.d;
    pcVar3 = (this_00->super_X509CertificateBase).versionString.d.ptr;
    (this_00->super_X509CertificateBase).versionString.d.d = local_58.d;
    (this_00->super_X509CertificateBase).versionString.d.ptr = local_58.ptr;
    qVar2 = (this_00->super_X509CertificateBase).versionString.d.size;
    (this_00->super_X509CertificateBase).versionString.d.size = local_58.size;
    local_58.d = pDVar1;
    local_58.ptr = pcVar3;
    local_58.size = qVar2;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    pAVar8 = q_X509_get_serialNumber(x509);
    if (pAVar8 != (ASN1_INTEGER *)0x0) {
      local_58.size = 0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      QByteArray::reserve((QByteArray *)&local_58,(long)pAVar8->length * 3);
      for (lVar7 = 0; lVar7 < pAVar8->length; lVar7 = lVar7 + 1) {
        QByteArray::number((int)&local_88,(uint)pAVar8->data[lVar7]);
        QByteArray::rightJustified((longlong)&local_70,(char)&local_88,true);
        QByteArray::append((QByteArray *)&local_58);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
        QByteArray::append((char)&local_58);
      }
      QByteArray::chop((longlong)&local_58);
      QByteArray::operator=
                (&(this_00->super_X509CertificateBase).serialNumberString,(QByteArray *)&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    parseExtensions(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
           (QExplicitlySharedDataPointer<QSslCertificatePrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QSslCertificate X509CertificateOpenSSL::certificateFromX509(X509 *x509)
{
    QSslCertificate certificate;

    auto *backend = QTlsBackend::backend<X509CertificateOpenSSL>(certificate);
    if (!backend || !x509)
        return certificate;

    ASN1_TIME *nbef = q_X509_getm_notBefore(x509);
    if (nbef)
        backend->notValidBefore = dateTimeFromASN1(nbef);

    ASN1_TIME *naft = q_X509_getm_notAfter(x509);
    if (naft)
        backend->notValidAfter = dateTimeFromASN1(naft);

    backend->null = false;
    backend->x509 = q_X509_dup(x509);

    backend->issuerInfoEntries = mapFromX509Name(q_X509_get_issuer_name(x509));
    backend->subjectInfoEntries = mapFromX509Name(q_X509_get_subject_name(x509));
    backend->versionString = QByteArray::number(qlonglong(q_X509_get_version(x509)) + 1);

    if (ASN1_INTEGER *serialNumber = q_X509_get_serialNumber(x509)) {
        QByteArray hexString;
        hexString.reserve(serialNumber->length * 3);
        for (int a = 0; a < serialNumber->length; ++a) {
            hexString += QByteArray::number(serialNumber->data[a], 16).rightJustified(2, '0');
            hexString += ':';
        }
        hexString.chop(1);
        backend->serialNumberString = hexString;
    }

    backend->parseExtensions();

    return certificate;
}